

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trivialre.h
# Opt level: O0

Matcher * __thiscall
trivialre::re_compiler::C<StringTestingBuilder,_trivialre::re_compiler::ErrorPolicy>::MaybeSeq
          (Matcher *__return_storage_ptr__,
          C<StringTestingBuilder,_trivialre::re_compiler::ErrorPolicy> *this,Matcher *left,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *right)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  Matcher local_68;
  Matcher local_48;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_28;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *right_local;
  Matcher *left_local;
  C<StringTestingBuilder,_trivialre::re_compiler::ErrorPolicy> *this_local;
  
  local_28 = right;
  right_local = (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)left;
  left_local = (Matcher *)this;
  this_local = (C<StringTestingBuilder,_trivialre::re_compiler::ErrorPolicy> *)
               __return_storage_ptr__;
  bVar1 = std::optional::operator_cast_to_bool((optional *)right);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_48,(string *)left);
    pbVar2 = std::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value(right);
    std::__cxx11::string::string((string *)&local_68,(string *)pbVar2);
    StringTestingBuilder::Seq(__return_storage_ptr__,&local_48,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)left);
  }
  return __return_storage_ptr__;
}

Assistant:

Matcher MaybeSeq(Matcher left, std::optional<Matcher> right) {
    if (right) {
      return builder.Seq(std::move(left), std::move(right.value()));
    }
    return left;
  }